

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptArray::BigIndex::DeleteItem
          (BigIndex *this,RecyclableObject *obj,PropertyOperationFlags flags)

{
  uint64 value;
  RecyclableObject *instance;
  bool bVar1;
  PropertyId propertyId;
  ScriptContext *scriptContext;
  PropertyRecord *local_30;
  PropertyRecord *propertyRecord;
  RecyclableObject *pRStack_20;
  PropertyOperationFlags flags_local;
  RecyclableObject *obj_local;
  BigIndex *this_local;
  
  propertyRecord._4_4_ = flags;
  pRStack_20 = obj;
  obj_local = (RecyclableObject *)this;
  bVar1 = IsSmallIndex(this);
  if (bVar1) {
    this_local._4_4_ =
         IndexTrace<unsigned_int>::DeleteItem(pRStack_20,&this->index,propertyRecord._4_4_);
  }
  else {
    value = this->bigIndex;
    scriptContext = RecyclableObject::GetScriptContext(pRStack_20);
    Js::JavascriptOperators::GetPropertyIdForInt(value,scriptContext,&local_30);
    instance = pRStack_20;
    propertyId = PropertyRecord::GetPropertyId(local_30);
    this_local._4_4_ =
         Js::JavascriptOperators::DeleteProperty(instance,propertyId,propertyRecord._4_4_);
  }
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptArray::BigIndex::DeleteItem(RecyclableObject* obj, PropertyOperationFlags flags) const
    {
        if (IsSmallIndex())
        {
            return small_index::DeleteItem(obj, index, flags);
        }
        else
        {
            PropertyRecord const * propertyRecord;
            JavascriptOperators::GetPropertyIdForInt(bigIndex, obj->GetScriptContext(), &propertyRecord);
            return JavascriptOperators::DeleteProperty(obj, propertyRecord->GetPropertyId(), flags);
        }
    }